

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

void mfascii(mFILE *mf)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = 1;
  if (1 < mf->size) {
    uVar3 = 1;
    do {
      pcVar1 = mf->data;
      if (pcVar1[uVar3] == '\n') {
        sVar2 = sVar2 - (pcVar1[uVar3 - 1] == '\r');
      }
      pcVar1[sVar2] = pcVar1[uVar3];
      uVar3 = uVar3 + 1;
      sVar2 = sVar2 + 1;
    } while (uVar3 < mf->size);
  }
  mf->size = sVar2;
  mf->offset = 0;
  mf->flush_pos = 0;
  return;
}

Assistant:

void mfascii(mFILE *mf) {
    size_t p1, p2;

    for (p1 = p2 = 1; p1 < mf->size; p1++, p2++) {
	if (mf->data[p1] == '\n' && mf->data[p1-1] == '\r') {
	    p2--; /* delete the \r */
	}
	mf->data[p2] = mf->data[p1];
    }
    mf->size = p2;

    mf->offset = mf->flush_pos = 0;
}